

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O2

void xmlDumpEntityContent(xmlBufferPtr buf,xmlChar *content)

{
  xmlChar xVar1;
  xmlChar *pxVar2;
  char *str;
  int len;
  long lVar3;
  
  if (buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE) {
    return;
  }
  pxVar2 = xmlStrchr(content,'%');
  if (pxVar2 == (xmlChar *)0x0) {
    xmlBufferWriteQuotedString(buf,content);
    return;
  }
  xmlBufferCCat(buf,"\"");
  do {
    lVar3 = 0;
    while( true ) {
      xVar1 = content[lVar3];
      len = (int)lVar3;
      if (xVar1 == '\0') {
        if (lVar3 != 0) {
          xmlBufferAdd(buf,content,len);
        }
        xmlBufferCCat(buf,"\"");
        return;
      }
      if (xVar1 == '%') {
        if (lVar3 != 0) {
          xmlBufferAdd(buf,content,len);
        }
        str = "&#x25;";
        goto LAB_00145951;
      }
      if (xVar1 == '\"') break;
      lVar3 = lVar3 + 1;
    }
    if (lVar3 != 0) {
      xmlBufferAdd(buf,content,len);
    }
    str = "&quot;";
LAB_00145951:
    xmlBufferAdd(buf,(xmlChar *)str,6);
    content = content + lVar3 + 1;
  } while( true );
}

Assistant:

static void
xmlDumpEntityContent(xmlBufferPtr buf, const xmlChar *content) {
    if (buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE) return;
    if (xmlStrchr(content, '%')) {
        const xmlChar * base, *cur;

	xmlBufferCCat(buf, "\"");
	base = cur = content;
	while (*cur != 0) {
	    if (*cur == '"') {
		if (base != cur)
		    xmlBufferAdd(buf, base, cur - base);
		xmlBufferAdd(buf, BAD_CAST "&quot;", 6);
		cur++;
		base = cur;
	    } else if (*cur == '%') {
		if (base != cur)
		    xmlBufferAdd(buf, base, cur - base);
		xmlBufferAdd(buf, BAD_CAST "&#x25;", 6);
		cur++;
		base = cur;
	    } else {
		cur++;
	    }
	}
	if (base != cur)
	    xmlBufferAdd(buf, base, cur - base);
	xmlBufferCCat(buf, "\"");
    } else {
        xmlBufferWriteQuotedString(buf, content);
    }
}